

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  PlatformInterface *pPVar3;
  bool bVar4;
  int iVar5;
  VkAllocationCallbacks *pVVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  Parameters *pPVar9;
  Parameters *extraout_RDX;
  Environment rootEnv;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  Resources res;
  Environment local_ac0;
  Environment local_a88;
  Move<vk::Handle<(vk::HandleType)18>_> local_a48;
  undefined1 local_a28 [8];
  Deleter<vk::Handle<(vk::HandleType)18>_> aDStack_a20 [4];
  ios_base local_9b0 [272];
  DeterministicFailAllocator local_8a0;
  AllocationCallbackRecorder local_850;
  AllocationCallbackRecorder local_7f0;
  EnvClone local_790;
  Resources local_d0;
  
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7f0,pVVar6,0x80);
  pPVar3 = context->m_platformInterface;
  pDVar7 = Context::getDeviceInterface(context);
  pVVar8 = Context::getDevice(context);
  local_ac0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_ac0.programBinaries = context->m_progCollection;
  local_ac0.allocationCallbacks =
       &local_7f0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_ac0.maxResourceConsumers = 1;
  local_ac0.vkp = pPVar3;
  local_ac0.vkd = pDVar7;
  local_ac0.device = pVVar8;
  tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  iVar5 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_a28 = (undefined1  [8])((ulong)(iVar5 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_790,&local_ac0,(Parameters *)local_a28,iVar5 - 1U);
  ComputePipeline::Resources::Resources(&local_d0,&local_790.env,extraout_RDX);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar2 = &(__return_storage_ptr__->m_description).field_2;
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::DeterministicFailAllocator::DeterministicFailAllocator
            (&local_8a0,pVVar6,MODE_COUNT_AND_FAIL,0);
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            (&local_850,&local_8a0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
            );
  pPVar9 = (Parameters *)(ulong)local_790.env.queueFamilyIndex;
  local_a88.vkp = local_790.env.vkp;
  local_a88.vkd = local_790.env.vkd;
  local_a88.device = local_790.env.device;
  local_a88.queueFamilyIndex = local_790.env.queueFamilyIndex;
  local_a88.programBinaries = local_790.env.programBinaries;
  local_a88.allocationCallbacks =
       &local_850.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a88.maxResourceConsumers = local_790.env.maxResourceConsumers;
  local_a28 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_a20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aDStack_a20,"Trying to create object with ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)aDStack_a20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_a20," allocation",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_a20,"s",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_a20," passing",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_a28,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_a20);
  std::ios_base::~ios_base(local_9b0);
  ComputePipeline::create(&local_a48,&local_a88,&local_d0,pPVar9);
  aDStack_a20[0].m_device =
       local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  aDStack_a20[0].m_allocator =
       local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_a28 = (undefined1  [8])
              local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  aDStack_a20[0].m_deviceIface =
       local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  if (local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (aDStack_a20,
               (VkPipeline)
               local_a48.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_850,0);
  if (bVar4) {
    local_a28 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_a20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_a20,"Object construction succeeded! ",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_a28,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_a20);
    std::ios_base::~ios_base(local_9b0);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_850);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_8a0.super_ChainedAllocator);
    bVar4 = true;
  }
  else {
    local_a28 = (undefined1  [8])&aDStack_a20[0].m_device;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a28,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar1,local_a28,
               (undefined1 *)
               ((long)local_a28 + (long)&(aDStack_a20[0].m_deviceIface)->_vptr_DeviceInterface));
    if (local_a28 != (undefined1  [8])&aDStack_a20[0].m_device) {
      operator_delete((void *)local_a28,(ulong)(aDStack_a20[0].m_device + 1));
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_850);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_8a0.super_ChainedAllocator);
    bVar4 = false;
  }
  ComputePipeline::Resources::~Resources(&local_d0);
  ::vk::DeviceDriver::~DeviceDriver(&local_790.vkd);
  if (local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_790.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_790.deviceRes.vki);
  if (local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  if (bVar4) {
    bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7f0,0);
    if (bVar4) {
      local_790.deviceRes.instance._0_8_ =
           &local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_790,"Allocation callbacks not called","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                 local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_790.deviceRes.instance._0_8_);
    }
    else {
      local_790.deviceRes.instance._0_8_ =
           &local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_790,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_790.deviceRes.instance._0_8_,
                 local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_790.deviceRes.instance._0_8_);
    }
    if ((Deleter<vk::VkInstance_s_*> *)local_790.deviceRes.instance._0_8_ !=
        &local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter) {
      operator_delete((void *)local_790.deviceRes.instance._0_8_,
                      (ulong)(local_790.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                              m_data.deleter.m_destroyInstance + 1));
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7f0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}